

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O0

void anon_unknown.dwarf_23ddf::generateRandomScanFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  uint *puVar6;
  reference pvVar7;
  Array2D<void_*> *pAVar8;
  void **ppvVar9;
  void *pvVar10;
  Compression in_EDX;
  int in_ESI;
  string *in_RDI;
  int k_1;
  int j_1;
  int i_4;
  uint l;
  int k;
  int j;
  int i_3;
  int pointerSize;
  int sampleSize;
  string str_1;
  stringstream ss_1;
  PixelType type_1;
  int i_2;
  DeepFrameBuffer frameBuffer;
  DeepScanLineOutputFile file;
  int i_1;
  Array<Imf_3_2::Array2D<void_*>_> data;
  string str;
  stringstream ss;
  int type;
  int i;
  anon_class_8_1_26b32173 generate_random_int;
  default_random_engine generator;
  float in_stack_fffffffffffff94c;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff954;
  undefined4 in_stack_fffffffffffff958;
  int in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  long in_stack_fffffffffffff968;
  DeepFrameBuffer *in_stack_fffffffffffff970;
  long in_stack_fffffffffffff9a8;
  Array<Imf_3_2::Array2D<void_*>_> *in_stack_fffffffffffff9b0;
  int local_524;
  int local_520;
  int local_51c;
  uint local_518;
  int local_514;
  int local_510;
  int local_50c;
  DeepSlice local_508 [56];
  int local_4d0;
  int local_4cc;
  DeepSlice local_4c8 [32];
  stringstream local_4a8 [16];
  ostream local_498 [376];
  PixelType local_320;
  int local_31c;
  Slice local_318 [56];
  Slice local_2e0 [104];
  undefined1 local_278 [40];
  Channel local_250 [16];
  Channel local_240 [16];
  Channel local_230 [16];
  Channel local_220 [32];
  stringstream local_200 [16];
  ostream local_1f0 [376];
  int local_78;
  int local_74;
  undefined1 *local_70;
  undefined1 local_68 [24];
  Vec2<float> local_50;
  Header local_48 [56];
  Compression local_10;
  int local_c;
  string *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"  generating deep scanline file \'");
  poVar3 = std::operator<<(poVar3,local_8);
  poVar3 = std::operator<<(poVar3,"\' compression ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<float>::Vec2(&local_50,0.0,0.0);
  Imf_3_2::Header::Header
            (local_48,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,
             local_10);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,local_48);
  Imf_3_2::Header::~Header(local_48);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x1226f9);
  local_70 = local_68;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x122715);
  for (local_74 = 0; local_74 < local_c; local_74 = local_74 + 1) {
    local_78 = generateRandomScanFile::anon_class_8_1_26b32173::operator()
                         ((anon_class_8_1_26b32173 *)
                          CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                          in_stack_fffffffffffff95c);
    std::__cxx11::stringstream::stringstream(local_200);
    std::ostream::operator<<(local_1f0,local_74);
    std::__cxx11::stringstream::str();
    if (local_78 == 0) {
      psVar4 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_230,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar4,local_220);
    }
    if (local_78 == 1) {
      psVar4 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_240,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(psVar4,local_220);
    }
    if (local_78 == 2) {
      psVar4 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_250,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar4,local_220);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958)
              );
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  for (local_278._20_4_ = 0; (int)local_278._20_4_ < local_c;
      local_278._20_4_ = local_278._20_4_ + 1) {
    Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  }
  Imf_3_2::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  remove(pcVar5);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)local_278,pcVar5,(Header *)(anonymous_namespace)::header,8);
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff970);
  puVar6 = Imf_3_2::Array2D<unsigned_int>::operator[]
                     ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,0);
  uVar11 = 0;
  Imf_3_2::Slice::Slice
            (local_318,UINT,
             (char *)(puVar6 + (-(long)(anonymous_namespace)::dataWindow -
                               (long)(DAT_001b5cbc * 0x111))),4,0x444,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_2e0);
  for (local_31c = 0; local_31c < local_c; local_31c = local_31c + 1) {
    local_320 = NUM_PIXELTYPES;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_31c);
    if (*pvVar7 == 0) {
      local_320 = UINT;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_31c);
    if (*pvVar7 == 1) {
      local_320 = HALF;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_31c);
    if (*pvVar7 == 2) {
      local_320 = FLOAT;
    }
    std::__cxx11::stringstream::stringstream(local_4a8);
    std::ostream::operator<<(local_498,local_31c);
    std::__cxx11::stringstream::str();
    local_4cc = 0;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_31c);
    if (*pvVar7 == 0) {
      local_4cc = 4;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_31c);
    if (*pvVar7 == 1) {
      local_4cc = 2;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_31c);
    PVar1 = local_320;
    if (*pvVar7 == 2) {
      local_4cc = 4;
    }
    local_4d0 = 8;
    pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
    ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_31c,0);
    in_stack_fffffffffffff960 = 0;
    uVar11 = 1;
    Imf_3_2::DeepSlice::DeepSlice
              (local_508,PVar1,
               (char *)(ppvVar9 +
                       (-(long)(anonymous_namespace)::dataWindow - (long)(DAT_001b5cbc * 0x111))),
               (long)local_4d0,(long)(local_4d0 * 0x111),(long)local_4cc,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert((string *)local_2e0,local_4c8);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::stringstream::~stringstream(local_4a8);
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)local_278);
  for (local_50c = 0; local_50c < 0xa9; local_50c = local_50c + 1) {
    for (local_510 = 0; local_510 < 0x111; local_510 = local_510 + 1) {
      iVar2 = generateRandomScanFile::anon_class_8_1_26b32173::operator()
                        ((anon_class_8_1_26b32173 *)
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         in_stack_fffffffffffff95c);
      puVar6 = Imf_3_2::Array2D<unsigned_int>::operator[]
                         ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,
                          (long)local_50c);
      puVar6[local_510] = iVar2 + 1;
      for (local_514 = 0; local_514 < local_c; local_514 = local_514 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_514);
        if (*pvVar7 == 0) {
          puVar6 = Imf_3_2::Array2D<unsigned_int>::operator[]
                             ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,
                              (long)local_50c);
          pvVar10 = operator_new__((ulong)puVar6[local_510] << 2);
          pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
          ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_514,(long)local_50c);
          ppvVar9[local_510] = pvVar10;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_514);
        if (*pvVar7 == 1) {
          puVar6 = Imf_3_2::Array2D<unsigned_int>::operator[]
                             ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,
                              (long)local_50c);
          pvVar10 = operator_new__((ulong)puVar6[local_510] * 2);
          pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
          ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_514,(long)local_50c);
          ppvVar9[local_510] = pvVar10;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_514);
        if (*pvVar7 == 2) {
          puVar6 = Imf_3_2::Array2D<unsigned_int>::operator[]
                             ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,
                              (long)local_50c);
          pvVar10 = operator_new__((ulong)puVar6[local_510] << 2);
          pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
          ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_514,(long)local_50c);
          ppvVar9[local_510] = pvVar10;
        }
        for (local_518 = 0;
            puVar6 = Imf_3_2::Array2D<unsigned_int>::operator[]
                               ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,
                                (long)local_50c), local_518 < puVar6[local_510];
            local_518 = local_518 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_514);
          if (*pvVar7 == 0) {
            pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
            ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_514,(long)local_50c);
            *(int *)((long)ppvVar9[local_510] + (ulong)local_518 * 4) =
                 (local_50c * 0x111 + local_510) % 0x801;
          }
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_514);
          if (*pvVar7 == 1) {
            pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
            Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_514,(long)local_50c);
            Imath_3_2::half::operator=
                      ((half *)CONCAT44(in_stack_fffffffffffff954,uVar11),in_stack_fffffffffffff94c)
            ;
          }
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (anonymous_namespace)::channelTypes,(long)local_514);
          if (*pvVar7 == 2) {
            pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
            ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_514,(long)local_50c);
            *(float *)((long)ppvVar9[local_510] + (ulong)local_518 * 4) =
                 (float)((local_50c * 0x111 + local_510) % 0x801);
          }
        }
      }
    }
  }
  Imf_3_2::DeepScanLineOutputFile::writePixels((int)local_278);
  for (local_51c = 0; local_51c < 0xa9; local_51c = local_51c + 1) {
    for (local_520 = 0; local_520 < 0x111; local_520 = local_520 + 1) {
      for (local_524 = 0; local_524 < local_c; local_524 = local_524 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_524);
        if (*pvVar7 == 0) {
          pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
          ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_524,(long)local_51c);
          if (ppvVar9[local_520] != (void *)0x0) {
            operator_delete__(ppvVar9[local_520]);
          }
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_524);
        if (*pvVar7 == 1) {
          pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
          ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_524,(long)local_51c);
          if (ppvVar9[local_520] != (void *)0x0) {
            operator_delete__(ppvVar9[local_520]);
          }
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_524);
        if (*pvVar7 == 2) {
          pAVar8 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_278 + 0x18));
          ppvVar9 = Imf_3_2::Array2D<void_*>::operator[](pAVar8 + local_524,(long)local_51c);
          in_stack_fffffffffffff970 = (DeepFrameBuffer *)ppvVar9[local_520];
          if (in_stack_fffffffffffff970 != (DeepFrameBuffer *)0x0) {
            operator_delete__(in_stack_fffffffffffff970);
          }
        }
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"  --> done");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x12369c);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)local_278);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array
            ((Array<Imf_3_2::Array2D<void_*>_> *)in_stack_fffffffffffff970);
  return;
}

Assistant:

void
generateRandomScanFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep scanline file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCountScans.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCountScans[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        //
        // Fill in data at the last minute.
        //

        for (int j = 0; j < width; j++)
        {
            sampleCountScans[i][j] = generate_random_int (10) + 1;
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    data[k][i][j] = new unsigned int[sampleCountScans[i][j]];
                if (channelTypes[k] == 1)
                    data[k][i][j] = new half[sampleCountScans[i][j]];
                if (channelTypes[k] == 2)
                    data[k][i][j] = new float[sampleCountScans[i][j]];
                for (unsigned int l = 0; l < sampleCountScans[i][j]; l++)
                {
                    if (channelTypes[k] == 0)
                        ((unsigned int*) data[k][i][j])[l] =
                            (i * width + j) % 2049;
                    if (channelTypes[k] == 1)
                        ((half*) data[k][i][j])[l] = (i * width + j) % 2049;
                    if (channelTypes[k] == 2)
                        ((float*) data[k][i][j])[l] = (i * width + j) % 2049;
                }
            }
        }
    }

    file.writePixels (height);

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }

    std::cout << "  --> done" << std::endl;
}